

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O3

_Bool trans_ebreak(DisasContext_conflict12 *ctx,arg_ebreak *a)

{
  TCGContext_conflict11 *tcg_ctx;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar1;
  
  generate_exception(ctx,3);
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->base).singlestep_enabled == true) {
    gen_exception_debug(tcg_ctx);
    uVar1 = extraout_AL;
  }
  else {
    tcg_gen_exit_tb_riscv64(tcg_ctx,(TranslationBlock *)0x0,0);
    uVar1 = extraout_AL_00;
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  return (_Bool)uVar1;
}

Assistant:

static bool trans_ebreak(DisasContext *ctx, arg_ebreak *a)
{
    // ignore this instruction
    generate_exception(ctx, RISCV_EXCP_BREAKPOINT);
    exit_tb(ctx); /* no chaining */
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}